

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O2

int __thiscall
tiger::trains::network::TCPSocket::connect
          (TCPSocket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  
  (this->serverSockAddr).sin_port = (ushort)__addr << 8 | (ushort)__addr >> 8;
  (this->serverSockAddr).sin_family = 2;
  (this->serverSockAddr).sin_addr.s_addr =
       (uint)__fd >> 0x18 | (__fd & 0xff0000U) >> 8 | (__fd & 0xff00U) << 8 | __fd << 0x18;
  iVar1 = ::connect(this->pSocket,(sockaddr *)&this->serverSockAddr,0x10);
  return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 == 0);
}

Assistant:

bool TCPSocket::connect(uint32_t addr, int port)
{
    serverSockAddr.sin_port = htons(port);
    serverSockAddr.sin_family = AF_INET;
    serverSockAddr.sin_addr.s_addr = htonl(addr);

    int retVal = ::connect(pSocket, (struct sockaddr *) &serverSockAddr, sizeof(serverSockAddr));
    return retVal == 0 ? true : false;
}